

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tet_weighted_ideal(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_location)

{
  REF_DBL *pRVar1;
  uint uVar2;
  double local_110;
  REF_INT local_104;
  double local_100;
  REF_INT local_f4;
  int local_f0;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL normalization;
  REF_DBL weight;
  REF_DBL quality;
  REF_DBL tet_ideal [3];
  REF_INT local_a8;
  REF_INT ixyz;
  REF_INT nodes [27];
  REF_INT local_30;
  int local_2c;
  REF_INT cell;
  REF_INT item;
  REF_DBL *ideal_location_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  _ref_private_macro_code_rss_1 = 0.0;
  for (tet_ideal[2]._4_4_ = 0; tet_ideal[2]._4_4_ < 3; tet_ideal[2]._4_4_ = tet_ideal[2]._4_4_ + 1)
  {
    ideal_location[tet_ideal[2]._4_4_] = 0.0;
  }
  if ((node < 0) || (ref_grid->cell[8]->ref_adj->nnode <= node)) {
    local_f0 = -1;
  }
  else {
    local_f0 = ref_grid->cell[8]->ref_adj->first[node];
  }
  local_2c = local_f0;
  if (local_f0 == -1) {
    local_f4 = -1;
  }
  else {
    local_f4 = ref_grid->cell[8]->ref_adj->item[local_f0].ref;
  }
  local_30 = local_f4;
  while( true ) {
    if (local_2c == -1) {
      if (_ref_private_macro_code_rss_1 * 1e+20 <= 0.0) {
        local_110 = -(_ref_private_macro_code_rss_1 * 1e+20);
      }
      else {
        local_110 = _ref_private_macro_code_rss_1 * 1e+20;
      }
      if (local_110 <= 1.0) {
        printf("normalization = %e\n",_ref_private_macro_code_rss_1);
        ref_grid_local._4_4_ = 4;
      }
      else {
        for (tet_ideal[2]._4_4_ = 0; tet_ideal[2]._4_4_ < 3;
            tet_ideal[2]._4_4_ = tet_ideal[2]._4_4_ + 1) {
          ideal_location[tet_ideal[2]._4_4_] =
               (1.0 / _ref_private_macro_code_rss_1) * ideal_location[tet_ideal[2]._4_4_];
        }
        ref_grid_local._4_4_ = 0;
      }
      return ref_grid_local._4_4_;
    }
    uVar2 = ref_smooth_tet_ideal(ref_grid,node,local_30,&quality);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x569,"ref_smooth_tet_weighted_ideal",(ulong)uVar2,"tet ideal");
      return uVar2;
    }
    uVar2 = ref_cell_nodes(ref_grid->cell[8],local_30,&local_a8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x56a,"ref_smooth_tet_weighted_ideal",(ulong)uVar2,"nodes");
      return uVar2;
    }
    uVar2 = ref_node_tet_quality(ref_grid->node,&local_a8,&weight);
    if (uVar2 != 0) break;
    pRVar1 = &ref_grid->adapt->smooth_min_quality;
    if (weight < *pRVar1 || weight == *pRVar1) {
      local_100 = ref_grid->adapt->smooth_min_quality;
    }
    else {
      local_100 = weight;
    }
    weight = local_100;
    _ref_private_macro_code_rss_1 = 1.0 / local_100 + _ref_private_macro_code_rss_1;
    for (tet_ideal[2]._4_4_ = 0; tet_ideal[2]._4_4_ < 3; tet_ideal[2]._4_4_ = tet_ideal[2]._4_4_ + 1
        ) {
      ideal_location[tet_ideal[2]._4_4_] =
           (1.0 / local_100) * tet_ideal[(long)tet_ideal[2]._4_4_ + -1] +
           ideal_location[tet_ideal[2]._4_4_];
    }
    local_2c = ref_grid->cell[8]->ref_adj->item[local_2c].next;
    if (local_2c == -1) {
      local_104 = -1;
    }
    else {
      local_104 = ref_grid->cell[8]->ref_adj->item[local_2c].ref;
    }
    local_30 = local_104;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x56c,
         "ref_smooth_tet_weighted_ideal",(ulong)uVar2,"tet qual");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_weighted_ideal(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *ideal_location) {
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ixyz;
  REF_DBL tet_ideal[3];
  REF_DBL quality, weight, normalization;

  normalization = 0.0;
  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] = 0.0;

  each_ref_cell_having_node(ref_grid_tet(ref_grid), node, item, cell) {
    RSS(ref_smooth_tet_ideal(ref_grid, node, cell, tet_ideal), "tet ideal");
    RSS(ref_cell_nodes(ref_grid_tet(ref_grid), cell, nodes), "nodes");
    RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
        "tet qual");
    quality = MAX(quality, ref_grid_adapt(ref_grid, smooth_min_quality));
    weight = 1.0 / quality;
    normalization += weight;
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] += weight * tet_ideal[ixyz];
  }

  if (ref_math_divisible(1.0, normalization)) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] = (1.0 / normalization) * ideal_location[ixyz];
  } else {
    printf("normalization = %e\n", normalization);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}